

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap256.h
# Opt level: O0

int re2::Bitmap256::FindLSBSet(uint64_t n)

{
  int iVar1;
  uint64_t n_local;
  
  if (n != 0) {
    iVar1 = 0;
    for (; (n & 1) == 0; n = n >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    return iVar1;
  }
  __assert_fail("(n) != (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/bitmap256.h"
                ,0x35,"static int re2::Bitmap256::FindLSBSet(uint64_t)");
}

Assistant:

static int FindLSBSet(uint64_t n) {
    DCHECK_NE(n, 0);
#if defined(__GNUC__)
    return __builtin_ctzll(n);
#elif defined(_MSC_VER) && defined(_M_X64)
    unsigned long c;
    _BitScanForward64(&c, n);
    return static_cast<int>(c);
#elif defined(_MSC_VER) && defined(_M_IX86)
    unsigned long c;
    if (static_cast<uint32_t>(n) != 0) {
      _BitScanForward(&c, static_cast<uint32_t>(n));
      return static_cast<int>(c);
    } else {
      _BitScanForward(&c, static_cast<uint32_t>(n >> 32));
      return static_cast<int>(c) + 32;
    }
#else
    int c = 63;
    for (int shift = 1 << 5; shift != 0; shift >>= 1) {
      uint64_t word = n << shift;
      if (word != 0) {
        n = word;
        c -= shift;
      }
    }
    return c;
#endif
  }